

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::isInt(Value *this)

{
  double d;
  char cVar1;
  bool bVar2;
  
  cVar1 = this->field_0x8;
  if (cVar1 == '\x03') {
    d = (this->value_).real_;
    bVar2 = false;
    if ((-2147483648.0 <= d) && (d <= 2147483647.0)) {
      bVar2 = IsIntegral(d);
      return bVar2;
    }
  }
  else if (cVar1 == '\x02') {
    bVar2 = (this->value_).uint_ >> 0x1f == 0;
  }
  else {
    if (cVar1 != '\x01') {
      return false;
    }
    bVar2 = (long)(int)(this->value_).int_ == (this->value_).int_;
  }
  return bVar2;
}

Assistant:

bool Value::isInt() const {
  switch (type_) {
  case intValue:
#if defined(JSON_HAS_INT64)
    return value_.int_ >= minInt && value_.int_ <= maxInt;
#else
    return true;
#endif
  case uintValue:
    return value_.uint_ <= UInt(maxInt);
  case realValue:
    return value_.real_ >= minInt && value_.real_ <= maxInt &&
           IsIntegral(value_.real_);
  default:
    break;
  }
  return false;
}